

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

char * fct_clp__optval2(fct_clp_t *clp,char *option,char *default_val)

{
  int iVar1;
  size_t sVar2;
  fctcl_t *clo;
  size_t idx;
  
  if (clp == (fct_clp_t *)0x0) {
    __assert_fail("clp != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x6d2
                  ,"const char *fct_clp__optval2(fct_clp_t *, const char *, const char *)");
  }
  sVar2 = fct_nlist__size(&clp->clo_list);
  idx = 0;
  do {
    if (sVar2 == idx) {
      return default_val;
    }
    clo = (fctcl_t *)fct_nlist__at(&clp->clo_list,idx);
    iVar1 = fctcl__is_option(clo,option);
    idx = idx + 1;
  } while (iVar1 == 0);
  if ((clo != (fctcl_t *)0x0) && (clo->value != (char *)0x0)) {
    default_val = clo->value;
  }
  return default_val;
}

Assistant:

static char const*
fct_clp__optval2(fct_clp_t *clp, char const *option, char const *default_val)
{
    fctcl_t const *clo =NULL;
    FCT_ASSERT( clp != NULL );
    FCT_ASSERT( option != NULL );
    clo = fct_clp__get_clo(clp, option);
    if ( clo == NULL || clo->value == NULL)
    {
        return default_val;
    }
    return clo->value;
}